

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O2

Str * __thiscall
mbc::Val::MessageBook::fullID(Str *__return_storage_ptr__,MessageBook *this,Str *ID)

{
  Str *this_00;
  bool bVar1;
  string *psVar2;
  undefined8 *puVar3;
  _List_node_base *p_Var4;
  string local_88;
  string local_68;
  MessageBook *local_48;
  Str *local_40;
  Str *local_38;
  
  p_Var4 = (_List_node_base *)this->order_;
  local_48 = this;
  local_40 = ID;
  local_38 = __return_storage_ptr__;
  do {
    p_Var4 = (((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)p_Var4)->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)local_48->order_) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_0013e760;
      __cxa_throw(puVar3,&bad_ID::typeinfo,std::exception::~exception);
    }
    std::__cxx11::string::string((string *)&local_88,(string *)(p_Var4 + 1));
    psVar2 = Str::raw_abi_cxx11_(local_40);
    std::__cxx11::string::string((string *)&local_68,(string *)psVar2);
    bVar1 = units::start_with(&local_88,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    this_00 = local_38;
  } while (!bVar1);
  Str::Str(local_38);
  _ValAtom::set(&this_00->super__ValAtom,(string *)(p_Var4 + 1));
  return this_00;
}

Assistant:

Str MessageBook::fullID(Str ID) {
    for(auto it = order_ -> begin(); it != order_ -> end(); ++it) {
        if (units::start_with(*it, ID.raw())) {
            Str result;
            result.set(*it);
            return result;
        }
    }
    throw bad_ID();
}